

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_IsInitialized_Test::TestBody
          (ReflectionOpsTest_IsInitialized_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_428;
  AssertHelper local_408;
  Message local_400;
  bool local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_378;
  Message local_370;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_330;
  Message local_328;
  bool local_319;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2e8;
  Message local_2e0;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2a0;
  Message local_298;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_258;
  Message local_250;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_210;
  Message local_208;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1c8;
  Message local_1c0;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_f0;
  Message local_e8 [3];
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  TestRequired message;
  ReflectionOpsTest_IsInitialized_Test *this_local;
  
  proto2_unittest::TestRequired::TestRequired((TestRequired *)&gtest_ar_.message_);
  bVar1 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_);
  local_c9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_c8,
               (AssertionResult *)"ReflectionOps::IsInitialized(message)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x146,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  bVar1 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_,true,false);
  local_121 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_120,
               (AssertionResult *)"ReflectionOps::IsInitialized(message, true, false)","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x147,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_169 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_,false,true);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_168,
               (AssertionResult *)"ReflectionOps::IsInitialized(message, false, true)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x148,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  proto2_unittest::TestRequired::set_a((TestRequired *)&gtest_ar_.message_,1);
  bVar1 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_);
  local_1b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1b0,
               (AssertionResult *)"ReflectionOps::IsInitialized(message)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x14a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  bVar1 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_,true,true);
  local_1f9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1f8,
               (AssertionResult *)"ReflectionOps::IsInitialized(message, true, true)","true","false"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x14b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_241 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_,false,true);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_240,&local_241,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_240,
               (AssertionResult *)"ReflectionOps::IsInitialized(message, false, true)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x14c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  proto2_unittest::TestRequired::set_b((TestRequired *)&gtest_ar_.message_,2);
  bVar1 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_);
  local_289 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_288,
               (AssertionResult *)"ReflectionOps::IsInitialized(message)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x14e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  bVar1 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_,true,true);
  local_2d1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_2d0,
               (AssertionResult *)"ReflectionOps::IsInitialized(message, true, true)","true","false"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x14f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_319 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_,false,true);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_318,&local_319,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_318,
               (AssertionResult *)"ReflectionOps::IsInitialized(message, false, true)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x150,pcVar2);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  proto2_unittest::TestRequired::set_c((TestRequired *)&gtest_ar_.message_,3);
  local_361 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_360,
               (AssertionResult *)"ReflectionOps::IsInitialized(message)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x152,pcVar2);
    testing::internal::AssertHelper::operator=(&local_378,&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  local_3a9 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_,true,false);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_3a8,
               (AssertionResult *)"ReflectionOps::IsInitialized(message, true, false)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x153,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  local_3f1 = ReflectionOps::IsInitialized((Message *)&gtest_ar_.message_,false,true);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f0,&local_3f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_428,(internal *)local_3f0,
               (AssertionResult *)"ReflectionOps::IsInitialized(message, false, true)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x154,pcVar2);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  proto2_unittest::TestRequired::~TestRequired((TestRequired *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ReflectionOpsTest, IsInitialized) {
  unittest::TestRequired message;

  EXPECT_FALSE(ReflectionOps::IsInitialized(message));
  EXPECT_FALSE(ReflectionOps::IsInitialized(message, true, false));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, false, true));
  message.set_a(1);
  EXPECT_FALSE(ReflectionOps::IsInitialized(message));
  EXPECT_FALSE(ReflectionOps::IsInitialized(message, true, true));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, false, true));
  message.set_b(2);
  EXPECT_FALSE(ReflectionOps::IsInitialized(message));
  EXPECT_FALSE(ReflectionOps::IsInitialized(message, true, true));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, false, true));
  message.set_c(3);
  EXPECT_TRUE(ReflectionOps::IsInitialized(message));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, true, false));
  EXPECT_TRUE(ReflectionOps::IsInitialized(message, false, true));
}